

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

void recvCompleteCallback
               (void *context,CONTROL_PACKET_TYPE packet,int flags,BUFFER_HANDLE headerData)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  size_t length;
  uchar *data;
  LOGGER_LOG p_Var4;
  STRING_HANDLE pSVar5;
  char *pcVar6;
  uint local_154;
  size_t local_150;
  size_t local_148;
  char *local_138;
  char *local_130;
  undefined4 local_128;
  undefined4 local_124;
  uint local_120;
  LOGGER_LOG l_9;
  STRING_HANDLE trace_log_4;
  STRING_HANDLE trace_log_3;
  LOGGER_LOG l_8;
  LOGGER_LOG p_Stack_f0;
  UNSUBSCRIBE_ACK unsuback;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  uint8_t qosRet;
  size_t malloc_size;
  STRING_HANDLE trace_log_2;
  size_t remainLen;
  SUBSCRIBE_ACK suback;
  LOGGER_LOG l_5;
  size_t size;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  BUFFER_HANDLE pubRel;
  STRING_HANDLE trace_log_1;
  PUBLISH_ACK publish_ack;
  LOGGER_LOG p_Stack_70;
  MQTT_CLIENT_EVENT_RESULT action;
  LOGGER_LOG l_2;
  STRING_HANDLE trace_log;
  uint8_t rc;
  LOGGER_LOG l_1;
  uint8_t connect_acknowledge_flags;
  LOGGER_LOG l;
  CONNECT_ACK connack;
  uint8_t *iterator;
  size_t packetLength;
  MQTT_CLIENT *mqtt_client;
  BUFFER_HANDLE headerData_local;
  int flags_local;
  CONTROL_PACKET_TYPE packet_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"recvCompleteCallback",0x3f1,1,"recvCompleteCallback context failed.");
    }
  }
  else {
    iterator = (uint8_t *)0x0;
    connack.isSessionPresent = false;
    connack._1_3_ = 0;
    connack.returnCode = CONNECTION_ACCEPTED;
    if (headerData != (BUFFER_HANDLE)0x0) {
      iterator = (uint8_t *)BUFFER_length(headerData);
      connack = (CONNECT_ACK)BUFFER_u_char(headerData);
    }
    if (((connack != (CONNECT_ACK)0x0) && (iterator != (uint8_t *)0x0)) || (packet == PINGRESP_TYPE)
       ) {
      if (packet == CONNACK_TYPE) {
        memset(&l,0,8);
        if (iterator == (uint8_t *)0x2) {
          bVar1 = byteutil_readByte((uint8_t **)&connack);
          if ((bVar1 & 0xfe) == 0) {
            l._0_1_ = bVar1 == 1;
            bVar1 = byteutil_readByte((uint8_t **)&connack);
            if (bVar1 < 6) {
              local_120 = (uint)bVar1;
            }
            else {
              local_120 = 6;
            }
            l._4_4_ = local_120;
            _Var2 = is_trace_enabled((MQTT_CLIENT *)context);
            if (_Var2) {
              pcVar6 = "false";
              if (((byte)l & 1) != 0) {
                pcVar6 = "true";
              }
              pSVar5 = STRING_construct_sprintf
                                 ("CONNACK | SESSION_PRESENT: %s | RETURN_CODE: 0x%x",pcVar6,
                                  (ulong)l._4_4_);
              log_incoming_trace((MQTT_CLIENT *)context,pSVar5);
              STRING_delete(pSVar5);
            }
            (**(code **)((long)context + 0x28))(context,1,&l,*(undefined8 *)((long)context + 0x38));
            if (l._4_4_ == 0) {
              *(ushort *)((long)context + 0xa0) = *(ushort *)((long)context + 0xa0) | 1;
            }
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                        ,"recvCompleteCallback",0x32b,1,"Invalid CONNACK packet.");
            }
            set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_COMMUNICATION_ERROR);
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                      ,"recvCompleteCallback",0x323,1,"Invalid CONNACK packet.");
          }
          set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_COMMUNICATION_ERROR);
        }
      }
      else if (packet == PUBLISH_TYPE) {
        ProcessPublishMessage((MQTT_CLIENT *)context,(uint8_t *)connack,(size_t)iterator,flags);
      }
      else if (((packet == PUBACK_TYPE) || (packet == PUBREC_TYPE)) ||
              ((packet == PUBREL_TYPE || (packet == PUBCOMP_TYPE)))) {
        if (iterator == (uint8_t *)0x2) {
          if (packet == PUBACK_TYPE) {
            local_124 = 2;
          }
          else {
            if (packet == PUBREC_TYPE) {
              local_128 = 3;
            }
            else {
              local_128 = 5;
              if (packet == PUBREL_TYPE) {
                local_128 = 4;
              }
            }
            local_124 = local_128;
          }
          trace_log_1._4_4_ = local_124;
          memset((void *)((long)&trace_log_1 + 2),0,2);
          trace_log_1._2_2_ = byteutil_read_uint16((uint8_t **)&connack,2);
          _Var2 = is_trace_enabled((MQTT_CLIENT *)context);
          if (_Var2) {
            if (packet == PUBACK_TYPE) {
              local_130 = "PUBACK";
            }
            else {
              if (packet == PUBREC_TYPE) {
                local_138 = "PUBREC";
              }
              else {
                local_138 = "PUBCOMP";
                if (packet == PUBREL_TYPE) {
                  local_138 = "PUBREL";
                }
              }
              local_130 = local_138;
            }
            pSVar5 = STRING_construct_sprintf
                               ("%s | PACKET_ID: %u",local_130,(ulong)trace_log_1._2_2_);
            log_incoming_trace((MQTT_CLIENT *)context,pSVar5);
            STRING_delete(pSVar5);
          }
          l_3 = (LOGGER_LOG)0x0;
          (**(code **)((long)context + 0x28))
                    (context,trace_log_1._4_4_,(long)&trace_log_1 + 2,
                     *(undefined8 *)((long)context + 0x38));
          if (packet == PUBREC_TYPE) {
            l_3 = (LOGGER_LOG)mqtt_codec_publishRelease(trace_log_1._2_2_);
            if ((BUFFER_HANDLE)l_3 == (BUFFER_HANDLE)0x0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                          ,"recvCompleteCallback",0x370,1,
                          "Failed to allocate publish release message.");
              }
              set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_MEMORY_ERROR);
            }
          }
          else if ((packet == PUBREL_TYPE) &&
                  (l_3 = (LOGGER_LOG)mqtt_codec_publishComplete(trace_log_1._2_2_),
                  (BUFFER_HANDLE)l_3 == (BUFFER_HANDLE)0x0)) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                        ,"recvCompleteCallback",0x379,1,
                        "Failed to allocate publish complete message.");
            }
            set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_MEMORY_ERROR);
          }
          if (l_3 != (LOGGER_LOG)0x0) {
            length = BUFFER_length((BUFFER_HANDLE)l_3);
            data = BUFFER_u_char((BUFFER_HANDLE)l_3);
            iVar3 = sendPacketItem((MQTT_CLIENT *)context,data,length);
            if (iVar3 != 0) {
              suback.qosCount = (size_t)xlogging_get_log_function();
              if ((LOGGER_LOG)suback.qosCount != (LOGGER_LOG)0x0) {
                (*(code *)suback.qosCount)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                           ,"recvCompleteCallback",0x382,1,"Failed sending publish reply.");
              }
              set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_COMMUNICATION_ERROR);
            }
            BUFFER_delete((BUFFER_HANDLE)l_3);
          }
        }
        else {
          p_Stack_70 = xlogging_get_log_function();
          if (p_Stack_70 != (LOGGER_LOG)0x0) {
            (*p_Stack_70)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                          ,"recvCompleteCallback",0x352,1,"Invalid packet length.");
          }
          set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_COMMUNICATION_ERROR);
        }
      }
      else if (packet == SUBACK_TYPE) {
        memset(&remainLen,0,0x18);
        remainLen._0_2_ = byteutil_read_uint16((uint8_t **)&connack,(size_t)iterator);
        trace_log_2 = (STRING_HANDLE)(iterator + -2);
        malloc_size = 0;
        _Var2 = is_trace_enabled((MQTT_CLIENT *)context);
        if (_Var2) {
          malloc_size = (size_t)STRING_construct_sprintf
                                          ("SUBACK | PACKET_ID: %u",(ulong)(uint16_t)remainLen);
        }
        if (trace_log_2 == (STRING_HANDLE)0x0) {
          local_148 = 0;
        }
        else {
          if (trace_log_2 < (STRING_HANDLE)0x4000000000000000) {
            local_150 = (long)trace_log_2 * 4;
          }
          else {
            local_150 = 0xffffffffffffffff;
          }
          local_148 = local_150;
        }
        if ((local_148 == 0xffffffffffffffff) ||
           (suback._0_8_ = malloc(local_148), (void *)suback._0_8_ == (void *)0x0)) {
          p_Stack_f0 = xlogging_get_log_function();
          if (p_Stack_f0 != (LOGGER_LOG)0x0) {
            (*p_Stack_f0)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                          ,"recvCompleteCallback",0x3c0,1,
                          "allocation of quality of service value failed, size:%zu",local_148);
          }
          set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_MEMORY_ERROR);
        }
        else {
          while (trace_log_2 != (STRING_HANDLE)0x0) {
            bVar1 = byteutil_readByte((uint8_t **)&connack);
            if ((bVar1 & 0x7c) != 0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                          ,"recvCompleteCallback",0x3a4,1,"Invalid SUBACK_TYPE packet.");
              }
              set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_COMMUNICATION_ERROR);
              break;
            }
            if (bVar1 < 3) {
              local_154 = (uint)bVar1;
            }
            else {
              local_154 = 0x80;
            }
            *(uint *)(suback._0_8_ + (long)suback.qosReturn * 4) = local_154;
            trace_log_2 = (STRING_HANDLE)((long)&trace_log_2[-1].s + 7);
            suback.qosReturn = (QOS_VALUE *)((long)suback.qosReturn + 1);
            _Var2 = is_trace_enabled((MQTT_CLIENT *)context);
            if (_Var2) {
              STRING_sprintf((STRING_HANDLE)malloc_size," | RETURN_CODE: %u",
                             (ulong)*(uint *)(suback._0_8_ + (long)((long)suback.qosReturn + -1) * 4
                                             ));
            }
          }
          _Var2 = is_trace_enabled((MQTT_CLIENT *)context);
          if (_Var2) {
            log_incoming_trace((MQTT_CLIENT *)context,(STRING_HANDLE)malloc_size);
            STRING_delete((STRING_HANDLE)malloc_size);
          }
          (**(code **)((long)context + 0x28))
                    (context,6,&remainLen,*(undefined8 *)((long)context + 0x38));
          free((void *)suback._0_8_);
        }
      }
      else if (packet == UNSUBACK_TYPE) {
        memset((void *)((long)&l_8 + 6),0,2);
        if (iterator == (uint8_t *)0x2) {
          l_8._6_2_ = byteutil_read_uint16((uint8_t **)&connack,2);
          _Var2 = is_trace_enabled((MQTT_CLIENT *)context);
          if (_Var2) {
            pSVar5 = STRING_construct_sprintf("UNSUBACK | PACKET_ID: %u",(ulong)l_8._6_2_);
            log_incoming_trace((MQTT_CLIENT *)context,pSVar5);
            STRING_delete(pSVar5);
          }
          (**(code **)((long)context + 0x28))
                    (context,7,(long)&l_8 + 6,*(undefined8 *)((long)context + 0x38));
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                      ,"recvCompleteCallback",0x3cb,1,"Invalid UNSUBACK packet length.");
          }
          set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_COMMUNICATION_ERROR);
        }
      }
      else if (packet == PINGRESP_TYPE) {
        *(undefined8 *)((long)context + 0xa8) = 0;
        _Var2 = is_trace_enabled((MQTT_CLIENT *)context);
        if (_Var2) {
          pSVar5 = STRING_construct_sprintf("PINGRESP");
          log_incoming_trace((MQTT_CLIENT *)context,pSVar5);
          STRING_delete(pSVar5);
        }
        (**(code **)((long)context + 0x28))(context,8,0,*(undefined8 *)((long)context + 0x38));
      }
    }
  }
  return;
}

Assistant:

static void recvCompleteCallback(void* context, CONTROL_PACKET_TYPE packet, int flags, BUFFER_HANDLE headerData)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)context;
    if (mqtt_client != NULL)
    {
        size_t packetLength = 0;
        uint8_t* iterator = NULL;
        if (headerData != NULL)
        {
            packetLength = BUFFER_length(headerData);
            iterator = BUFFER_u_char(headerData);
        }

#ifdef ENABLE_RAW_TRACE
        logIncomingRawTrace(mqtt_client, packet, (uint8_t)flags, iterator, packetLength);
#endif
        if ((iterator != NULL && packetLength > 0) || packet == PINGRESP_TYPE)
        {
            switch (packet)
            {
                case CONNACK_TYPE:
                {
                    /*Codes_SRS_MQTT_CLIENT_07_028: [If the actionResult parameter is of type CONNECT_ACK then the msgInfo value shall be a CONNECT_ACK structure.]*/
                    CONNECT_ACK connack = { 0 };
                    if (packetLength != 2) // CONNACK payload must be only 2 bytes
                    {
                        LogError("Invalid CONNACK packet.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    uint8_t connect_acknowledge_flags = byteutil_readByte(&iterator);
                    if (connect_acknowledge_flags & 0xFE) // bits 7-1 must be zero
                    {
                        LogError("Invalid CONNACK packet.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    connack.isSessionPresent = (connect_acknowledge_flags == 0x1) ? true : false;
                    uint8_t rc = byteutil_readByte(&iterator);
                    connack.returnCode =
                        (rc < ((uint8_t)CONN_REFUSED_UNKNOWN)) ?
                        (CONNECT_RETURN_CODE)rc : CONN_REFUSED_UNKNOWN;

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("CONNACK | SESSION_PRESENT: %s | RETURN_CODE: 0x%x", connack.isSessionPresent ? TRUE_CONST : FALSE_CONST, connack.returnCode);
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_CONNACK, (void*)&connack, mqtt_client->ctx);

                    if (connack.returnCode == CONNECTION_ACCEPTED)
                    {
                        mqtt_client->mqtt_status |= MQTT_STATUS_CLIENT_CONNECTED;
                    }
                    break;
                }
                case PUBLISH_TYPE:
                {
                    ProcessPublishMessage(mqtt_client, iterator, packetLength, flags);
                    break;
                }
                case PUBACK_TYPE:
                case PUBREC_TYPE:
                case PUBREL_TYPE:
                case PUBCOMP_TYPE:
                {
                    if (packetLength != 2) // PUBXXX payload must be only 2 bytes
                    {
                        LogError("Invalid packet length.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    /*Codes_SRS_MQTT_CLIENT_07_029: [If the actionResult parameter are of types PUBACK_TYPE, PUBREC_TYPE, PUBREL_TYPE or PUBCOMP_TYPE then the msgInfo value shall be a PUBLISH_ACK structure.]*/
                    MQTT_CLIENT_EVENT_RESULT action = (packet == PUBACK_TYPE) ? MQTT_CLIENT_ON_PUBLISH_ACK :
                        (packet == PUBREC_TYPE) ? MQTT_CLIENT_ON_PUBLISH_RECV :
                        (packet == PUBREL_TYPE) ? MQTT_CLIENT_ON_PUBLISH_REL : MQTT_CLIENT_ON_PUBLISH_COMP;

                    PUBLISH_ACK publish_ack = { 0 };
                    publish_ack.packetId = byteutil_read_uint16(&iterator, packetLength);

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("%s | PACKET_ID: %"PRIu16, packet == PUBACK_TYPE ? "PUBACK" : (packet == PUBREC_TYPE) ? "PUBREC" : (packet == PUBREL_TYPE) ? "PUBREL" : "PUBCOMP",
                            publish_ack.packetId);

                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    BUFFER_HANDLE pubRel = NULL;
                    mqtt_client->fnOperationCallback(mqtt_client, action, (void*)&publish_ack, mqtt_client->ctx);
                    if (packet == PUBREC_TYPE)
                    {
                        pubRel = mqtt_codec_publishRelease(publish_ack.packetId);
                        if (pubRel == NULL)
                        {
                            LogError("Failed to allocate publish release message.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                        }
                    }
                    else if (packet == PUBREL_TYPE)
                    {
                        pubRel = mqtt_codec_publishComplete(publish_ack.packetId);
                        if (pubRel == NULL)
                        {
                            LogError("Failed to allocate publish complete message.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                        }
                    }
                    if (pubRel != NULL)
                    {
                        size_t size = BUFFER_length(pubRel);
                        if (sendPacketItem(mqtt_client, BUFFER_u_char(pubRel), size) != 0)
                        {
                            LogError("Failed sending publish reply.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        }
                        BUFFER_delete(pubRel);
                    }
                    break;
                }
                case SUBACK_TYPE:
                {

                    /*Codes_SRS_MQTT_CLIENT_07_030: [If the actionResult parameter is of type SUBACK_TYPE then the msgInfo value shall be a SUBSCRIBE_ACK structure.]*/
                    SUBSCRIBE_ACK suback = { 0 };

                    size_t remainLen = packetLength;
                    suback.packetId = byteutil_read_uint16(&iterator, packetLength);
                    remainLen -= 2;

#ifndef NO_LOGGING
                    STRING_HANDLE trace_log = NULL;
                    if (is_trace_enabled(mqtt_client))
                    {
                        trace_log = STRING_construct_sprintf("SUBACK | PACKET_ID: %"PRIu16, suback.packetId);
                    }
#endif
                    // Allocate the remaining len
                    size_t malloc_size = safe_multiply_size_t(sizeof(QOS_VALUE), remainLen);
                    if (malloc_size != SIZE_MAX && 
                        (suback.qosReturn = (QOS_VALUE*)malloc(malloc_size)) != NULL)
                    {
                        while (remainLen > 0)
                        {
                            uint8_t qosRet = byteutil_readByte(&iterator);
                            if (qosRet & 0x7C) // SUBACK QOS bits 6-2 must be zero
                            {
                                LogError("Invalid SUBACK_TYPE packet.");
                                set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                                break;
                            }
                            suback.qosReturn[suback.qosCount++] =
                                (qosRet <= ((uint8_t)DELIVER_EXACTLY_ONCE)) ?
                                (QOS_VALUE)qosRet :  DELIVER_FAILURE;
                            remainLen--;
#ifndef NO_LOGGING
                            if (is_trace_enabled(mqtt_client))
                            {
                                STRING_sprintf(trace_log, " | RETURN_CODE: %"PRIu16, suback.qosReturn[suback.qosCount-1]);
                            }
#endif
                        }

#ifndef NO_LOGGING
                        if (is_trace_enabled(mqtt_client))
                        {
                            log_incoming_trace(mqtt_client, trace_log);
                            STRING_delete(trace_log);
                        }
#endif
                        mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_SUBSCRIBE_ACK, (void*)&suback, mqtt_client->ctx);
                        free(suback.qosReturn);
                    }
                    else
                    {
                        LogError("allocation of quality of service value failed, size:%zu", malloc_size);
                        set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                    }
                    break;
                }
                case UNSUBACK_TYPE:
                {
                    /*Codes_SRS_MQTT_CLIENT_07_031: [If the actionResult parameter is of type UNSUBACK_TYPE then the msgInfo value shall be a UNSUBSCRIBE_ACK structure.]*/
                    UNSUBSCRIBE_ACK unsuback = { 0 };
                    if (packetLength != 2) // UNSUBACK_TYPE payload must be only 2 bytes
                    {
                        LogError("Invalid UNSUBACK packet length.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    unsuback.packetId = byteutil_read_uint16(&iterator, packetLength);

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("UNSUBACK | PACKET_ID: %"PRIu16, unsuback.packetId);
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_UNSUBSCRIBE_ACK, (void*)&unsuback, mqtt_client->ctx);
                    break;
                }
                case PINGRESP_TYPE:
                    mqtt_client->timeSincePing = 0;
#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("PINGRESP");
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    // Forward ping response to operation callback
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_PING_RESPONSE, NULL, mqtt_client->ctx);
                    break;
                default:
                    break;
            }
        }
    }
    else
    {
        LogError("recvCompleteCallback context failed.");
    }
}